

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall LLVMBC::ModuleParseContext::resolve_forward_references(ModuleParseContext *this)

{
  BasicBlock *this_00;
  bool bVar1;
  reference ppVVar2;
  reference ppBVar3;
  Instruction *this_01;
  Instruction *inst;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  __end2;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  __begin2;
  BasicBlock *__range2;
  BasicBlock *bb;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<BasicBlock_*> *__range1_1;
  ValueProxy *ref;
  iterator __end1;
  iterator __begin1;
  Vector<ValueProxy_*> *__range1;
  ModuleParseContext *this_local;
  
  __end1 = std::vector<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
           ::begin(&this->pending_forward_references);
  ref = (ValueProxy *)
        std::vector<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>::
        end(&this->pending_forward_references);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<LLVMBC::ValueProxy_**,_std::vector<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>_>
                                *)&ref);
    if (!bVar1) {
      std::vector<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>::
      clear(&this->pending_forward_references);
      __end1_1 = std::
                 vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                 ::begin(&this->basic_blocks);
      bb = (BasicBlock *)
           std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
           ::end(&this->basic_blocks);
      do {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
                            *)&bb);
        if (!bVar1) {
          return true;
        }
        ppBVar3 = __gnu_cxx::
                  __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
                  ::operator*(&__end1_1);
        this_00 = *ppBVar3;
        __end2 = BasicBlock::begin(this_00);
        inst = (Instruction *)BasicBlock::end(this_00);
        while (bVar1 = IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
                       ::operator!=(&__end2,(IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
                                             *)&inst), bVar1) {
          this_01 = IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
                    ::operator*(&__end2);
          bVar1 = Instruction::resolve_proxy_values(this_01);
          if (!bVar1) {
            return false;
          }
          IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
          ::operator++(&__end2);
        }
        __gnu_cxx::
        __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
        ::operator++(&__end1_1);
      } while( true );
    }
    ppVVar2 = __gnu_cxx::
              __normal_iterator<LLVMBC::ValueProxy_**,_std::vector<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>_>
              ::operator*(&__end1);
    bVar1 = ValueProxy::resolve(*ppVVar2);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<LLVMBC::ValueProxy_**,_std::vector<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool ModuleParseContext::resolve_forward_references()
{
	for (auto *ref : pending_forward_references)
		if (!ref->resolve())
			return false;
	pending_forward_references.clear();

	for (auto *bb : basic_blocks)
		for (auto &inst : *bb)
			if (!inst.resolve_proxy_values())
				return false;

	return true;
}